

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O2

void __thiscall DatalogDatabase::smartEvalRules(DatalogDatabase *this,ostream *out)

{
  pointer *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  int num_nodes;
  ulong uVar8;
  int j;
  ulong uVar9;
  long lVar10;
  undefined1 local_120 [8];
  graph depend_graph;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> pnums;
  undefined1 local_a0 [8];
  graph rg;
  undefined1 local_58 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  comps;
  
  uVar8 = (ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  num_nodes = (int)uVar8;
  rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  graph::graph((graph *)local_120,num_nodes);
  uVar7 = 0;
  uVar4 = 0;
  if (0 < num_nodes) {
    uVar4 = uVar8 & 0xffffffff;
  }
  for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    for (uVar9 = 0; (uVar8 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
      bVar3 = isRuleDependant(*(Rule **)(*(long *)(rg.temp_node_arr.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 0xc) + uVar7 * 8),
                              *(Rule **)(*(long *)(rg.temp_node_arr.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 0xc) + uVar9 * 8));
      if (bVar3) {
        graph::add_edge((graph *)local_120,(int)uVar7,(int)uVar9);
      }
    }
  }
  poVar5 = std::operator<<(out,"Dependency Graph");
  std::endl<char,std::char_traits<char>>(poVar5);
  graph::toString_abi_cxx11_((string *)local_a0,(graph *)local_120);
  poVar5 = std::operator<<(out,(string *)local_a0);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)local_a0);
  poVar5 = std::operator<<(out,"Reverse Graph");
  std::endl<char,std::char_traits<char>>(poVar5);
  graph::reverse((graph *)local_a0,(graph *)local_120);
  graph::toString_abi_cxx11_((string *)local_58,(graph *)local_a0);
  poVar5 = std::operator<<(out,(string *)local_58);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)local_58);
  graph::DFSForest((vector<int,_std::allocator<int>_> *)local_d0,(graph *)local_a0);
  poVar5 = std::operator<<(out,"Postorder Numbers");
  std::endl<char,std::char_traits<char>>(poVar5);
  graph::pos_nums_abi_cxx11_((string *)local_58,(graph *)local_a0);
  poVar5 = std::operator<<(out,(string *)local_58);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)local_58);
  poVar5 = std::operator<<(out,"SCC Search Order");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_d0);
  print_rules(num_nodes,
              (vector<int,_std::allocator<int>_> *)
              &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,out);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::endl<char,std::char_traits<char>>(out);
  graph::SCC((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_58,(graph *)local_120);
  uVar4 = 0;
  do {
    if ((ulong)(((long)comps.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_58) / 0x18) <= uVar4)
    {
      poVar5 = std::operator<<(out,"Rule Evaluation Complete");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_58);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_d0);
      graph::~graph((graph *)local_a0);
      graph::~graph((graph *)local_120);
      return;
    }
    std::operator<<(out,"SCC:");
    lVar10 = uVar4 * 0x18;
    lVar1 = *(long *)((long)local_58 + lVar10 + 8);
    lVar2 = *(long *)((long)local_58 + lVar10);
    for (lVar6 = 0; lVar1 - lVar2 >> 2 != lVar6; lVar6 = lVar6 + 1) {
      poVar5 = std::operator<<(out," R");
      std::ostream::operator<<
                ((ostream *)poVar5,*(int *)(*(long *)((long)local_58 + lVar10) + lVar6 * 4));
    }
    std::endl<char,std::char_traits<char>>(out);
    if (lVar1 - lVar2 == 4) {
      bVar3 = graph::has_edge((graph *)local_120,**(int **)((long)local_58 + lVar10),
                              **(int **)((long)local_58 + lVar10));
      if (bVar3) goto LAB_00114cba;
      evaluateRule((DatalogDatabase *)
                   rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   *(Rule **)(*(long *)(rg.temp_node_arr.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 0xc) +
                             (long)**(int **)((long)local_58 + lVar10) * 8),out);
      std::endl<char,std::char_traits<char>>(out);
    }
    else {
LAB_00114cba:
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)((long)local_58 + lVar10));
      this_00 = &depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      fixed_point((DatalogDatabase *)
                  rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                  (vector<int,_std::allocator<int>_> *)this_00,out);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)this_00);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void DatalogDatabase::smartEvalRules(ostream& out)
{
  int nrules = rules.size();
  graph depend_graph = graph(nrules);
  for (int i=0; i < nrules; i++)
  {
    for (int j = 0; j < nrules; j++)
    {
      //check if rule i depends on j
      if (isRuleDependant(rules[i], rules[j])) depend_graph.add_edge(i, j);
    }

  }

  //ouput dependancy graph
  out << "Dependency Graph" << endl;
  out << depend_graph.toString() << endl;
  out << "Reverse Graph" << endl;
  graph rg = depend_graph.reverse();
  out << rg.toString() << endl;
  vector<int> pnums = rg.DFSForest();
  out << "Postorder Numbers"  << endl;
  out << rg.pos_nums() << endl;
  out << "SCC Search Order" << endl;
  print_rules(nrules, pnums, out);
  out<<endl;

  vector<vector<int>> comps = depend_graph.SCC();
  for (size_t c= 0; c < comps.size(); c++)
  {
    out << "SCC:";
    size_t csize = comps[c].size();
    for (size_t i = 0; i < csize; i++)
    {
      out << " R" << comps[c][i];
    }
    out << endl;
    if (csize == 1 && !depend_graph.has_edge(comps[c][0], comps[c][0]))
    {
      evaluateRule(rules[comps[c][0]], out);
      out << endl;
      continue;
    }
    fixed_point(comps[c], out);
  }
  out << "Rule Evaluation Complete" << endl << endl;
}